

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

int mwIsSafeAddr(void *p,uint len)

{
  int iVar1;
  
  if (p == (void *)0x0) {
    return 0;
  }
  if (len != 0) {
    mwOldSIGSEGV = (mwSignalHandlerPtr)signal(0xb,mwSIGSEGV);
    iVar1 = _setjmp((__jmp_buf_tag *)mwSIGSEGVjump);
    signal(0xb,(__sighandler_t)mwOldSIGSEGV);
    return (int)(iVar1 == 0);
  }
  return 1;
}

Assistant:

int mwIsSafeAddr(void *p, unsigned len)
{
	char *ptr;

	if (p == NULL) {
		return 0;
	}
	if (!len) {
		return 1;
	}

	/* set up to catch the SIGSEGV signal */
	mwOldSIGSEGV = signal(SIGSEGV, mwSIGSEGV);

	if (setjmp(mwSIGSEGVjump)) {
		signal(SIGSEGV, mwOldSIGSEGV);
		return 0;
	}

	/* read and write-back all the bytes in the range */
	ptr = (char *)p;
	ptr += len;

	/* the reason for this rather strange construct is that */
	/* we want to keep the number of used parameters and locals */
	/* to a minimum. if we use len for a counter gcc will complain */
	/* it may get clobbered by longjmp() at high warning levels. */
	/* it's a harmless warning, but this way we don't have to see it. */
	do {
		ptr --;
		*ptr = mwDummy(*ptr);
	} while ((void *) ptr != p);

	/* remove the handler */
	signal(SIGSEGV, mwOldSIGSEGV);

	return 1;
}